

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtrimCollFunc(void *pUser,int nKey1,void *pKey1,int nKey2,void *pKey2)

{
  int iVar1;
  bool bVar2;
  u8 *pK2;
  u8 *pK1;
  void *pKey2_local;
  int nKey2_local;
  void *pKey1_local;
  int nKey1_local;
  void *pUser_local;
  
  pKey1_local._4_4_ = nKey1;
  while( true ) {
    bVar2 = false;
    if (pKey1_local._4_4_ != 0) {
      bVar2 = *(char *)((long)pKey1 + (long)(pKey1_local._4_4_ + -1)) == ' ';
    }
    pKey2_local._4_4_ = nKey2;
    if (!bVar2) break;
    pKey1_local._4_4_ = pKey1_local._4_4_ + -1;
  }
  while( true ) {
    bVar2 = false;
    if (pKey2_local._4_4_ != 0) {
      bVar2 = *(char *)((long)pKey2 + (long)(pKey2_local._4_4_ + -1)) == ' ';
    }
    if (!bVar2) break;
    pKey2_local._4_4_ = pKey2_local._4_4_ + -1;
  }
  iVar1 = binCollFunc(pUser,pKey1_local._4_4_,pKey1,pKey2_local._4_4_,pKey2);
  return iVar1;
}

Assistant:

static int rtrimCollFunc(
  void *pUser,
  int nKey1, const void *pKey1,
  int nKey2, const void *pKey2
){
  const u8 *pK1 = (const u8*)pKey1;
  const u8 *pK2 = (const u8*)pKey2;
  while( nKey1 && pK1[nKey1-1]==' ' ) nKey1--;
  while( nKey2 && pK2[nKey2-1]==' ' ) nKey2--;
  return binCollFunc(pUser, nKey1, pKey1, nKey2, pKey2);
}